

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freecell.c
# Opt level: O1

MovePack * freecell_movePackGet(Board *board)

{
  ulong uVar1;
  byte bVar2;
  Card *pCVar3;
  byte *pbVar4;
  Card *pCVar5;
  byte *pbVar6;
  byte *pbVar7;
  long lVar8;
  long lVar9;
  MovePack *movePack;
  Spot *pSVar10;
  Move *pMVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  long lVar16;
  ulong uVar17;
  uchar uVar18;
  long lVar19;
  ulong uVar20;
  bool bVar21;
  undefined8 uStack_c0;
  int aiStack_b8 [2];
  Spot *apSStack_b0 [2];
  Spot *cells [4];
  Spot *foundations [4];
  
  apSStack_b0[0] = (Spot *)0x103e63;
  movePack = movePack_create();
  bVar21 = (gConfig.game)->id == SEAHAVENTOWERS;
  uVar1 = (ulong)bVar21 * 2 + 8;
  lVar8 = -(ulong)((uint)bVar21 << 4 | 0x40);
  lVar9 = lVar8 + -0xa8;
  uVar12 = 0;
  bVar15 = 0;
  do {
    uVar18 = (uchar)uVar12;
    if (uVar12 < 4) {
      *(undefined8 *)((long)apSStack_b0 + lVar8) = 0x103ebc;
      pSVar10 = board_spotGet(board,FOUNDATION,uVar18);
      cells[uVar12 + 3] = pSVar10;
      *(undefined8 *)((long)apSStack_b0 + lVar8) = 0x103ed1;
      pSVar10 = board_spotGet(board,CELL,uVar18);
      cells[uVar12 - 1] = pSVar10;
      bVar15 = bVar15 + (pSVar10->cardsCount == '\0');
    }
    *(undefined8 *)((long)apSStack_b0 + lVar8) = 0x103ef1;
    pSVar10 = board_spotGet(board,TABLEAU,uVar18);
    *(Spot **)((long)cells + uVar12 * 8 + lVar9 + 0xa0) = pSVar10;
    uVar12 = uVar12 + 1;
  } while (uVar1 != uVar12);
  lVar19 = 0;
  do {
    bVar2 = cells[lVar19 + -1]->cardsCount;
    if (bVar2 != 0) {
      pCVar3 = cells[lVar19 + -1]->cards[bVar2 - 1];
      uVar18 = (uchar)lVar19;
      uVar12 = 0;
      do {
        lVar16 = *(long *)((long)cells + uVar12 * 8 + lVar9 + 0xa0);
        bVar2 = *(byte *)(lVar16 + 2);
        if (bVar2 == 0) {
          if ((((gConfig.game)->id != SEAHAVENTOWERS) && ((gConfig.game)->id != BAKERSGAMEKINGSONLY)
              ) || (pCVar3->rank == '\r')) {
LAB_00103fbc:
            *(undefined8 *)((long)aiStack_b8 + lVar8) = 0xffffffffffffffff;
            *(undefined8 *)((long)&uStack_c0 + lVar8) = 0x103fe0;
            pMVar11 = move_create(MOVE,CELL,uVar18,-1,TABLEAU,(uchar)uVar12,
                                  *(int *)((long)aiStack_b8 + lVar8));
            *(undefined8 *)((long)apSStack_b0 + lVar8) = 0x103ff0;
            movePack_add(movePack,pMVar11);
          }
        }
        else {
          pbVar4 = *(byte **)(*(long *)(lVar16 + 8) + (ulong)(bVar2 - 1) * 8);
          if (pCVar3->rank + 1 == (uint)*pbVar4) {
            if (((gConfig.game)->id < 0x11) && ((0x10006U >> ((gConfig.game)->id & 0x1f) & 1) != 0))
            {
              bVar21 = pCVar3->suit == pbVar4[1];
            }
            else {
              bVar21 = pCVar3->color != pbVar4[2];
            }
            if (bVar21) goto LAB_00103fbc;
          }
        }
        uVar12 = uVar12 + 1;
      } while (uVar1 != uVar12);
      lVar16 = 0;
      do {
        bVar2 = cells[lVar16 + 3]->cardsCount;
        if (bVar2 == 0) {
          if (pCVar3->rank == '\x01') {
            *(undefined8 *)((long)aiStack_b8 + lVar8) = 0xffffffffffffffff;
            *(undefined8 *)((long)&uStack_c0 + lVar8) = 0x1040af;
            pMVar11 = move_create(MOVE,CELL,uVar18,-1,FOUNDATION,(uchar)lVar16,
                                  *(int *)((long)aiStack_b8 + lVar8));
            *(undefined8 *)((long)apSStack_b0 + lVar8) = 0x1040bf;
            movePack_add(movePack,pMVar11);
            break;
          }
        }
        else {
          pCVar5 = cells[lVar16 + 3]->cards[bVar2 - 1];
          if ((pCVar5->rank + 1 == (uint)pCVar3->rank) && (pCVar3->suit == pCVar5->suit)) {
            *(undefined8 *)((long)aiStack_b8 + lVar8) = 0xffffffffffffffff;
            *(undefined8 *)((long)&uStack_c0 + lVar8) = 0x104063;
            pMVar11 = move_create(MOVE,CELL,uVar18,-1,FOUNDATION,(uchar)lVar16,
                                  *(int *)((long)aiStack_b8 + lVar8));
            *(undefined8 *)((long)apSStack_b0 + lVar8) = 0x104073;
            movePack_add(movePack,pMVar11);
          }
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != 4);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 4);
  uVar12 = 0;
  do {
    lVar19 = *(long *)((long)cells + uVar12 * 8 + lVar9 + 0xa0);
    if ((*(char *)(lVar19 + 2) != '\0') &&
       (uVar20 = (ulong)*(byte *)(lVar19 + 2), *(byte *)(lVar19 + 2) != 0)) {
      uVar17 = 0;
      uVar14 = 1;
LAB_00104109:
      if ((int)uVar20 - (int)uVar17 <= (int)(bVar15 + 1)) {
        lVar16 = *(long *)(lVar19 + 8);
        pbVar4 = *(byte **)(lVar16 + uVar17 * 8);
        uVar13 = uVar14;
        do {
          if (uVar20 <= uVar13) {
            uVar20 = 0;
            goto LAB_00104196;
          }
          pbVar6 = *(byte **)(lVar16 + -8 + uVar13 * 8);
          pbVar7 = *(byte **)(lVar16 + uVar13 * 8);
          if (*pbVar7 + 1 != (uint)*pbVar6) break;
          if (((gConfig.game)->id < 0x11) && ((0x10006U >> ((gConfig.game)->id & 0x1f) & 1) != 0)) {
            bVar21 = pbVar7[1] == pbVar6[1];
          }
          else {
            bVar21 = pbVar7[2] != pbVar6[2];
          }
          uVar13 = uVar13 + 1;
        } while (bVar21);
      }
      goto LAB_00104274;
    }
LAB_0010428b:
    uVar12 = uVar12 + 1;
  } while (uVar12 != uVar1);
  lVar19 = 0;
  while (cells[lVar19 + -1]->cardsCount != '\0') {
    lVar19 = lVar19 + 1;
    if (lVar19 == 4) goto LAB_0010430e;
  }
  uVar12 = 0;
  do {
    if (*(char *)(*(long *)((long)cells + uVar12 * 8 + lVar9 + 0xa0) + 2) != '\0') {
      *(undefined8 *)((long)aiStack_b8 + lVar8) = 0xffffffffffffffff;
      *(undefined8 *)((long)&uStack_c0 + lVar8) = 0x1042f2;
      pMVar11 = move_create(MOVE,TABLEAU,(uchar)uVar12,-1,CELL,(uchar)lVar19,
                            *(int *)((long)aiStack_b8 + lVar8));
      *(undefined8 *)((long)apSStack_b0 + lVar8) = 0x104302;
      movePack_add(movePack,pMVar11);
    }
    uVar12 = uVar12 + 1;
  } while (uVar1 != uVar12);
LAB_0010430e:
  uVar12 = 0;
  do {
    lVar19 = *(long *)((long)cells + uVar12 * 8 + lVar9 + 0xa0);
    bVar15 = *(byte *)(lVar19 + 2);
    if (bVar15 != 0) {
      pbVar4 = *(byte **)(*(long *)(lVar19 + 8) + (ulong)(bVar15 - 1) * 8);
      lVar19 = 0;
      do {
        bVar15 = cells[lVar19 + 3]->cardsCount;
        if (bVar15 == 0) {
          if (*pbVar4 == 1) {
            *(undefined8 *)((long)aiStack_b8 + lVar8) = 0xffffffffffffffff;
            *(undefined8 *)((long)&uStack_c0 + lVar8) = 0x1043f0;
            pMVar11 = move_create(MOVE,TABLEAU,(uchar)uVar12,-1,FOUNDATION,(uchar)lVar19,
                                  *(int *)((long)aiStack_b8 + lVar8));
            *(undefined8 *)((long)apSStack_b0 + lVar8) = 0x104400;
            movePack_add(movePack,pMVar11);
            break;
          }
        }
        else {
          pCVar3 = cells[lVar19 + 3]->cards[bVar15 - 1];
          if ((pCVar3->rank + 1 == (uint)*pbVar4) && (pbVar4[1] == pCVar3->suit)) {
            *(undefined8 *)((long)aiStack_b8 + lVar8) = 0xffffffffffffffff;
            *(undefined8 *)((long)&uStack_c0 + lVar8) = 0x1043a5;
            pMVar11 = move_create(MOVE,TABLEAU,(uchar)uVar12,-1,FOUNDATION,(uchar)lVar19,
                                  *(int *)((long)aiStack_b8 + lVar8));
            *(undefined8 *)((long)apSStack_b0 + lVar8) = 0x1043b5;
            movePack_add(movePack,pMVar11);
          }
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != 4);
    }
    uVar12 = uVar12 + 1;
    if (uVar12 == uVar1) {
      return movePack;
    }
  } while( true );
LAB_00104196:
  do {
    if (uVar12 != uVar20) {
      lVar16 = *(long *)((long)cells + uVar20 * 8 + lVar9 + 0xa0);
      bVar2 = *(byte *)(lVar16 + 2);
      if (((uVar17 == 0) || (bVar2 != 0)) ||
         ((((gConfig.game)->id == SEAHAVENTOWERS || ((gConfig.game)->id == BAKERSGAMEKINGSONLY)) &&
          (*pbVar4 != 0xd)))) {
        if ((bVar2 != 0) &&
           (pbVar6 = *(byte **)(*(long *)(lVar16 + 8) + (ulong)(bVar2 - 1) * 8),
           *pbVar4 + 1 == (uint)*pbVar6)) {
          if (((gConfig.game)->id < 0x11) && ((0x10006U >> ((gConfig.game)->id & 0x1f) & 1) != 0)) {
            bVar21 = pbVar4[1] == pbVar6[1];
          }
          else {
            bVar21 = pbVar4[2] != pbVar6[2];
          }
          if (bVar21) goto LAB_00104232;
        }
      }
      else {
LAB_00104232:
        *(undefined8 *)((long)aiStack_b8 + lVar8) = 0xffffffffffffffff;
        *(undefined8 *)((long)&uStack_c0 + lVar8) = 0x104254;
        pMVar11 = move_create(MOVE,TABLEAU,(uchar)uVar12,(int)uVar17,TABLEAU,(uchar)uVar20,
                              *(int *)((long)aiStack_b8 + lVar8));
        *(undefined8 *)((long)apSStack_b0 + lVar8) = 0x104264;
        movePack_add(movePack,pMVar11);
      }
    }
    uVar20 = uVar20 + 1;
  } while (uVar1 != uVar20);
LAB_00104274:
  uVar17 = uVar17 + 1;
  uVar20 = (ulong)*(byte *)(lVar19 + 2);
  uVar14 = uVar14 + 1;
  if (uVar20 <= uVar17) goto LAB_0010428b;
  goto LAB_00104109;
}

Assistant:

MovePack * freecell_movePackGet(Board * board)
{
	MovePack * movePack = movePack_create();
	unsigned char i, j, k;
	unsigned char openCellCount=0;
	unsigned char tableauCount = gConfig.game->id==SEAHAVENTOWERS ? 10 : 8;
	bool correctlyStacked;
	Spot * cells[4];
	Spot * foundations[4];
	Spot * tableaus[tableauCount];
	Card * card;

	for(i=0;i<tableauCount;i++)
	{
		if(i<4)
		{
			foundations[i] = board_spotGet(board, FOUNDATION, i);
			cells[i] = board_spotGet(board, CELL, i);
			if(cells[i]->cardsCount==0)
				openCellCount++;
		}
		tableaus[i] = board_spotGet(board, TABLEAU, i);
	}

	// Cell
	for(i=0;i<4;i++)
	{
		if(cells[i]->cardsCount==0)
			continue;

		card = cells[i]->cards[cells[i]->cardsCount-1];

		// Cell->Tableau
		for(j=0;j<tableauCount;j++)
		{
			if((tableaus[j]->cardsCount==0 && ((gConfig.game->id!=BAKERSGAMEKINGSONLY && gConfig.game->id!=SEAHAVENTOWERS) || card->rank==13)) || (tableaus[j]->cardsCount>0 && freecell_validCardTableauDrop(card, tableaus[j]->cards[tableaus[j]->cardsCount-1])))
				movePack_add(movePack, move_create(MOVE, CELL, i, -1, TABLEAU, j, -1));
		}

		// Cell->Foundation
		for(j=0;j<4;j++)
		{
			if(foundations[j]->cardsCount==0 && card->rank==1)
			{
				movePack_add(movePack, move_create(MOVE, CELL, i, -1, FOUNDATION, j, -1));
				// All empty foundations are created equal, if moving an Ace, there is no need to entertain moving to the other foundations
				break;
			}
			else if(foundations[j]->cardsCount>0 && card->rank==foundations[j]->cards[foundations[j]->cardsCount-1]->rank+1 && card->suit==foundations[j]->cards[foundations[j]->cardsCount-1]->suit)
			{
				movePack_add(movePack, move_create(MOVE, CELL, i, -1, FOUNDATION, j, -1));
			}
		}
	}

	// Tableau->Tableau
	for(i=0;i<tableauCount;i++)
	{
		if(tableaus[i]->cardsCount==0)
			continue;

		for(j=0;j<tableaus[i]->cardsCount;j++)
		{
			card = tableaus[i]->cards[j];

			// Ensure stack not too long
			if((tableaus[i]->cardsCount-j)>(openCellCount+1))
				continue;

			// And is correctly stacked
			for(correctlyStacked=true,k=(j+1);k<tableaus[i]->cardsCount;k++)
			{
				if(!freecell_validCardTableauDrop(tableaus[i]->cards[k], tableaus[i]->cards[(k-1)]))
				{
					correctlyStacked = false;
					break;
				}
			}

			if(!correctlyStacked)
				continue;

			//printf("tableau %d at index %d has correctly ranked card: %s\n", i, j, card_print(card, false));

			for(k=0;k<tableauCount;k++)
			{
				if(k==i)
					continue;

				if((tableaus[k]->cardsCount==0 && j>0 && ((gConfig.game->id!=BAKERSGAMEKINGSONLY && gConfig.game->id!=SEAHAVENTOWERS) || card->rank==13)) ||
				   (tableaus[k]->cardsCount>0 && freecell_validCardTableauDrop(card, tableaus[k]->cards[tableaus[k]->cardsCount-1])))
				{
					movePack_add(movePack, move_create(MOVE, TABLEAU, i, j, TABLEAU, k, -1));
				}
			}
		}
	}

	// Tableau->Cell
	for(i=0;i<4;i++)
	{
		if(cells[i]->cardsCount>0)
			continue;

		for(j=0;j<tableauCount;j++)
		{
			if(tableaus[j]->cardsCount==0)
				continue;

			movePack_add(movePack, move_create(MOVE, TABLEAU, j, -1, CELL, i, -1));
		}

		break;
	}

	// Tableau->Foundation
	for(i=0;i<tableauCount;i++)
	{
		if(tableaus[i]->cardsCount==0)
			continue;

		card = tableaus[i]->cards[tableaus[i]->cardsCount-1];

		for(j=0;j<4;j++)
		{
			if(foundations[j]->cardsCount==0 && card->rank==1)
			{
				movePack_add(movePack, move_create(MOVE, TABLEAU, i, -1, FOUNDATION, j, -1));
				// All empty foundations are created equal, if moving an Ace, there is no need to entertain moving to the other foundations
				break;
			   
			}
			else if(foundations[j]->cardsCount>0 && card->rank==foundations[j]->cards[foundations[j]->cardsCount-1]->rank+1 && card->suit==foundations[j]->cards[foundations[j]->cardsCount-1]->suit)
			{
				movePack_add(movePack, move_create(MOVE, TABLEAU, i, -1, FOUNDATION, j, -1));
			}
		}
	}

	return movePack;
}